

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O1

float CombinedShannonEntropy_C(int *X,int *Y)

{
  uint uVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  
  lVar6 = 0;
  fVar2 = 0.0;
  uVar5 = 0;
  uVar3 = 0;
  do {
    uVar1 = X[lVar6];
    uVar4 = Y[lVar6];
    if ((ulong)uVar1 == 0) {
      if ((ulong)uVar4 != 0) {
        if (uVar4 < 0x100) {
          fVar7 = kSLog2Table[uVar4];
        }
        else {
          fVar7 = (*VP8LFastSLog2Slow)(uVar4);
        }
        uVar5 = uVar5 + uVar4;
        fVar2 = fVar2 - fVar7;
      }
    }
    else {
      if (uVar1 < 0x100) {
        fVar7 = kSLog2Table[uVar1];
      }
      else {
        fVar7 = (*VP8LFastSLog2Slow)(uVar1);
      }
      uVar4 = uVar4 + uVar1;
      if (uVar4 < 0x100) {
        fVar8 = kSLog2Table[uVar4];
      }
      else {
        fVar8 = (*VP8LFastSLog2Slow)(uVar4);
      }
      uVar3 = uVar3 + uVar1;
      uVar5 = uVar4 + uVar5;
      fVar2 = (fVar2 - fVar7) - fVar8;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  if (uVar3 < 0x100) {
    fVar7 = kSLog2Table[uVar3];
  }
  else {
    fVar7 = (*VP8LFastSLog2Slow)(uVar3);
  }
  if (uVar5 < 0x100) {
    fVar8 = kSLog2Table[uVar5];
  }
  else {
    fVar8 = (*VP8LFastSLog2Slow)(uVar5);
  }
  return fVar2 + fVar7 + fVar8;
}

Assistant:

static float CombinedShannonEntropy_C(const int X[256], const int Y[256]) {
  int i;
  double retval = 0.;
  int sumX = 0, sumXY = 0;
  for (i = 0; i < 256; ++i) {
    const int x = X[i];
    if (x != 0) {
      const int xy = x + Y[i];
      sumX += x;
      retval -= VP8LFastSLog2(x);
      sumXY += xy;
      retval -= VP8LFastSLog2(xy);
    } else if (Y[i] != 0) {
      sumXY += Y[i];
      retval -= VP8LFastSLog2(Y[i]);
    }
  }
  retval += VP8LFastSLog2(sumX) + VP8LFastSLog2(sumXY);
  return (float)retval;
}